

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_array.hpp
# Opt level: O2

void __thiscall
test::CustomArray<std::vector<int,_std::allocator<int>_>,_10UL>::CustomArray
          (CustomArray<std::vector<int,_std::allocator<int>_>,_10UL> *this,
          initializer_list<std::vector<int,_std::allocator<int>_>_> il)

{
  runtime_error *this_00;
  
  memset(this,0,0xf0);
  if (il._M_len == 10) {
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::vector<int,std::allocator<int>>const*,std::vector<int,std::allocator<int>>*>
              (il._M_array,il._M_array + 10,this->array);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"init list size does not match array size");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CustomArray(std::initializer_list<T> il)
  {
    if (il.size() != N) { throw std::runtime_error("init list size does not match array size"); }
    std::copy(il.begin(), il.end(), std::begin(array));
  }